

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectMeshTextureCoords(XFileParser *this,Mesh *pMesh)

{
  pointer paVar1;
  uint uVar2;
  uint uVar3;
  uint a;
  ulong uVar4;
  ulong __new_size;
  aiVector2D aVar5;
  allocator<char> local_41;
  string local_40;
  
  readHeadOfDataObject(this,(string *)0x0);
  uVar2 = pMesh->mNumTextures;
  uVar3 = uVar2 + 1;
  if (8 < uVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Too many sets of texture coordinates",&local_41);
    ThrowException(this,&local_40);
  }
  pMesh->mNumTextures = uVar3;
  uVar3 = ReadInt(this);
  __new_size = (ulong)uVar3;
  if (((long)(pMesh->mPositions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(pMesh->mPositions).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start) / 0xc == __new_size) {
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
              (pMesh->mTexCoords + uVar2,__new_size);
    for (uVar4 = 0; __new_size != uVar4; uVar4 = uVar4 + 1) {
      aVar5 = ReadVector2(this);
      paVar1 = pMesh->mTexCoords[uVar2].
               super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start + uVar4;
      paVar1->x = aVar5.x;
      paVar1->y = aVar5.y;
    }
    CheckForClosingBrace(this);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Texture coord count does not match vertex count",&local_41);
  ThrowException(this,&local_40);
}

Assistant:

void XFileParser::ParseDataObjectMeshTextureCoords( Mesh* pMesh)
{
    readHeadOfDataObject();
    if( pMesh->mNumTextures + 1 > AI_MAX_NUMBER_OF_TEXTURECOORDS)
        ThrowException( "Too many sets of texture coordinates");

    std::vector<aiVector2D>& coords = pMesh->mTexCoords[pMesh->mNumTextures++];

    unsigned int numCoords = ReadInt();
    if( numCoords != pMesh->mPositions.size())
        ThrowException( "Texture coord count does not match vertex count");

    coords.resize( numCoords);
    for( unsigned int a = 0; a < numCoords; a++)
        coords[a] = ReadVector2();

    CheckForClosingBrace();
}